

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O0

bool __thiscall CDirectiveArea::Validate(CDirectiveArea *this,ValidateState *state)

{
  long space;
  long lVar1;
  long position;
  int64_t position_00;
  int64_t space_00;
  int64_t usage;
  bool bVar2;
  int iVar3;
  Architecture *pAVar4;
  int64_t iVar5;
  pointer pCVar6;
  int64_t oldFileID;
  undefined1 local_58;
  undefined7 uStack_57;
  ValidateState contentValidation;
  bool result;
  int64_t oldPosition;
  int64_t oldContentSize;
  int64_t oldAreaSize;
  ValidateState *state_local;
  CDirectiveArea *this_local;
  
  space = this->areaSize;
  lVar1 = this->contentSize;
  position = this->position;
  bVar2 = Expression::isLoaded(&this->positionExpression);
  if (bVar2) {
    bVar2 = Expression::evaluateInteger<long>(&this->positionExpression,&this->position);
    if (!bVar2) {
      Logger::queueError<>(Error,"Invalid position expression");
      return false;
    }
    pAVar4 = Architecture::current();
    (*pAVar4->_vptr_Architecture[3])();
    FileManager::seekVirtual(g_fileManager,this->position);
  }
  else {
    iVar5 = FileManager::getVirtualAddress(g_fileManager);
    this->position = iVar5;
  }
  bVar2 = Expression::evaluateInteger<long>(&this->sizeExpression,&this->areaSize);
  if (bVar2) {
    if (this->areaSize < 0) {
      Logger::queueError<>(Error,"Negative area size");
      this_local._7_1_ = false;
    }
    else {
      bVar2 = Expression::isLoaded(&this->fillExpression);
      if ((!bVar2) ||
         (bVar2 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillValue),
         bVar2)) {
        contentValidation._23_1_ = 0;
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->content);
        if (bVar2) {
          contentValidation.noFileChangeDirective = *(char **)&state->passes;
          _local_58 = CONCAT71((int7)((ulong)*(undefined8 *)state >> 8),1);
          contentValidation._0_8_ = (long)".area" + 1;
          pCVar6 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                   operator->(&this->content);
          CAssemblerCommand::applyFileInfo(pCVar6);
          pCVar6 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                   operator->(&this->content);
          iVar3 = (*pCVar6->_vptr_CAssemblerCommand[2])(pCVar6,&local_58);
          contentValidation._23_1_ = (byte)iVar3 & 1;
        }
        iVar5 = FileManager::getVirtualAddress(g_fileManager);
        this->contentSize = iVar5 - this->position;
        CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
        if (this->areaSize < this->contentSize) {
          oldFileID = this->contentSize - this->areaSize;
          Logger::queueError<long,long>
                    (Error,"Area at %08x overflowed by %d bytes",&this->position,&oldFileID);
        }
        bVar2 = Expression::isLoaded(&this->fillExpression);
        if ((bVar2) || (((this->super_CAssemblerCommand).field_0x14 & 1) != 0)) {
          FileManager::advanceMemory(g_fileManager,this->areaSize - this->contentSize);
        }
        if ((this->areaSize != space) || (this->contentSize != lVar1)) {
          contentValidation._23_1_ = 1;
        }
        lVar1 = this->fileID;
        iVar5 = FileManager::getOpenFileID(g_fileManager);
        this->fileID = iVar5;
        if ((((lVar1 != this->fileID) || (position != this->position)) || (this->areaSize == 0)) &&
           (space != 0)) {
          Allocations::forgetArea(lVar1,position,space);
        }
        if (this->areaSize != 0) {
          iVar5 = this->fileID;
          position_00 = this->position;
          space_00 = this->areaSize;
          usage = this->contentSize;
          bVar2 = Expression::isLoaded(&this->fillExpression);
          Allocations::setArea
                    (iVar5,position_00,space_00,usage,bVar2,
                     (bool)((this->super_CAssemblerCommand).field_0x14 & 1));
        }
        this_local._7_1_ = (bool)(contentValidation._23_1_ & 1);
      }
      else {
        Logger::queueError<>(Error,"Invalid fill expression");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    Logger::queueError<>(Error,"Invalid size expression");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CDirectiveArea::Validate(const ValidateState &state)
{
	int64_t oldAreaSize = areaSize;
	int64_t oldContentSize = contentSize;
	int64_t oldPosition = position;

	if (positionExpression.isLoaded())
	{
		if (!positionExpression.evaluateInteger(position))
		{
			Logger::queueError(Logger::Error, "Invalid position expression");
			return false;
		}
		Architecture::current().NextSection();
		g_fileManager->seekVirtual(position);
	}
	else
		position = g_fileManager->getVirtualAddress();

	if (!sizeExpression.evaluateInteger(areaSize))
	{
		Logger::queueError(Logger::Error, "Invalid size expression");
		return false;
	}

	if (areaSize < 0)
	{
		Logger::queueError(Logger::Error, "Negative area size");
		return false;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillValue))
		{
			Logger::queueError(Logger::Error, "Invalid fill expression");
			return false;
		}
	}

	bool result = false;
	if (content)
	{
		ValidateState contentValidation = state;
		contentValidation.noFileChange = true;
		contentValidation.noFileChangeDirective = "area";
		content->applyFileInfo();
		result = content->Validate(contentValidation);
	}
	contentSize = g_fileManager->getVirtualAddress()-position;

	// restore info of this command
	applyFileInfo();

	if (areaSize < contentSize)
	{
		Logger::queueError(Logger::Error, "Area at %08x overflowed by %d bytes", position, contentSize - areaSize);
	}

	if (fillExpression.isLoaded() || shared)
		g_fileManager->advanceMemory(areaSize-contentSize);

	if (areaSize != oldAreaSize || contentSize != oldContentSize)
		result = true;

	int64_t oldFileID = fileID;
	fileID = g_fileManager->getOpenFileID();

	if ((oldFileID != fileID || oldPosition != position || areaSize == 0) && oldAreaSize != 0)
		Allocations::forgetArea(oldFileID, oldPosition, oldAreaSize);
	if (areaSize != 0)
		Allocations::setArea(fileID, position, areaSize, contentSize, fillExpression.isLoaded(), shared);

	return result;
}